

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O1

uint xmlGlobalRandom(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  xmlMutexLock(&xmlRngMutex);
  uVar1 = globalRngState[0] * -0x61c88645;
  uVar3 = globalRngState[0] * -0x3910c8a0;
  uVar2 = globalRngState[1] ^ globalRngState[0];
  globalRngState[0] = uVar2 << 9 ^ (globalRngState[0] << 0x1a | globalRngState[0] >> 6) ^ uVar2;
  globalRngState[1] = uVar2 << 0xd | uVar2 >> 0x13;
  xmlMutexUnlock(&xmlRngMutex);
  return (uVar1 >> 0x1b | uVar3) * 5;
}

Assistant:

unsigned
xmlGlobalRandom(void) {
    unsigned ret;

    xmlMutexLock(&xmlRngMutex);
    ret = xoroshiro64ss(globalRngState);
    xmlMutexUnlock(&xmlRngMutex);

    return(ret);
}